

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authentication(connectdata *conn)

{
  _Bool _Var1;
  saslprogress local_2c;
  anon_union_224_10_26c073a1_for_proto *paStack_28;
  saslprogress progress;
  imap_conn *imapc;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  paStack_28 = &conn->proto;
  pcStack_18 = conn;
  _Var1 = Curl_sasl_can_authenticate(&(conn->proto).imapc.sasl,conn);
  if (_Var1) {
    imapc._4_4_ = Curl_sasl_start(&(paStack_28->imapc).sasl,pcStack_18,
                                  (_Bool)((paStack_28->imapc).ir_supported & 1),&local_2c);
    if (imapc._4_4_ == CURLE_OK) {
      if (local_2c == SASL_INPROGRESS) {
        state(pcStack_18,IMAP_AUTHENTICATE);
      }
      else if ((((paStack_28->imapc).login_disabled & 1U) == 0) &&
              (((paStack_28->imapc).preftype & 1) != 0)) {
        imapc._4_4_ = imap_perform_login(pcStack_18);
      }
      else {
        Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
        imapc._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    conn_local._4_4_ = imapc._4_4_;
  }
  else {
    state(pcStack_18,IMAP_STOP);
    conn_local._4_4_ = imapc._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  /* Check we have enough data to authenticate with and end the
     connect phase if we don't */
  if(!Curl_sasl_can_authenticate(&imapc->sasl, conn)) {
    state(conn, IMAP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&imapc->sasl, conn, imapc->ir_supported, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      state(conn, IMAP_AUTHENTICATE);
    else if(!imapc->login_disabled && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}